

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void jx9_context_release_value(jx9_context *pCtx,jx9_value *pValue)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((pValue != (jx9_value *)0x0) && (uVar4 = (ulong)(pCtx->sVar).nUsed, uVar4 != 0)) {
    pvVar3 = (pCtx->sVar).pBase;
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        return;
      }
      uVar1 = uVar5 + 1;
      lVar2 = uVar5 * 8;
      uVar5 = uVar1;
    } while (*(jx9_value **)((long)pvVar3 + lVar2) != pValue);
    jx9MemObjRelease(pValue);
    SyMemBackendPoolFree(&pCtx->pVm->sAllocator,pValue);
    *(undefined8 *)((long)pvVar3 + uVar1 * 8 + -8) = 0;
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9VmReleaseContextValue(
	jx9_context *pCtx, /* Call context */
	jx9_value *pValue  /* Release this value */
	)
{
	if( pValue == 0 ){
		/* NULL value is a harmless operation */
		return;
	}
	if( SySetUsed(&pCtx->sVar) > 0 ){
		jx9_value **apObj = (jx9_value **)SySetBasePtr(&pCtx->sVar);
		sxu32 n;
		for( n = 0 ; n < SySetUsed(&pCtx->sVar) ; ++n ){
			if( apObj[n] == pValue ){
				jx9MemObjRelease(pValue);
				SyMemBackendPoolFree(&pCtx->pVm->sAllocator, pValue);
				/* Mark as released */
				apObj[n] = 0;
				break;
			}
		}
	}
}